

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cc
# Opt level: O3

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: aes options hex-key infile outfile");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  -cbc         -- disable CBC mode");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  +cbc         -- enable CBC mode");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  -encrypt     -- encrypt");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  -decrypt     -- decrypt CBC mode");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  -zero-iv     -- use zero initialization vector");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  -static-iv   -- use static initialization vector");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  -no-padding  -- disable padding");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Options must precede key and file names.");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(2);
}

Assistant:

static void
usage()
{
    std::cerr << "Usage: aes options hex-key infile outfile" << std::endl
              << "  -cbc         -- disable CBC mode" << std::endl
              << "  +cbc         -- enable CBC mode" << std::endl
              << "  -encrypt     -- encrypt" << std::endl
              << "  -decrypt     -- decrypt CBC mode" << std::endl
              << "  -zero-iv     -- use zero initialization vector" << std::endl
              << "  -static-iv   -- use static initialization vector" << std::endl
              << "  -no-padding  -- disable padding" << std::endl
              << "Options must precede key and file names." << std::endl;
    exit(2);
}